

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three-colour-triplets-recognizer.cpp
# Opt level: O1

set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> * __thiscall
mahjong::ThreeColourTripletsRecognizer::recognize
          (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
           *__return_storage_ptr__,ThreeColourTripletsRecognizer *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  undefined4 in_EAX;
  long lVar3;
  initializer_list<mahjong::Pattern> __l;
  initializer_list<mahjong::Pattern> __l_00;
  undefined4 uStack_18;
  Pattern local_14;
  
  if ((this->front_tile_count_of_triplets_or_quads)._M_elems[0] == 3) {
    _uStack_18 = CONCAT44(0x1d,in_EAX);
    __l._M_len = 1;
    __l._M_array = &local_14;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
              (__return_storage_ptr__,__l,(less<mahjong::Pattern> *)((long)&uStack_18 + 3),
               (allocator_type *)((long)&uStack_18 + 2));
  }
  else {
    lVar2 = 0;
    do {
      lVar3 = lVar2;
      if (lVar3 == 0x20) goto LAB_0019a936;
      lVar2 = lVar3 + 4;
    } while (*(int *)((long)(this->front_tile_count_of_triplets_or_quads)._M_elems + lVar3 + 4) != 3
            );
    _uStack_18 = CONCAT44(0x1d,in_EAX);
    __l_00._M_len = 1;
    __l_00._M_array = &local_14;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
              (__return_storage_ptr__,__l_00,(less<mahjong::Pattern> *)((long)&uStack_18 + 3),
               (allocator_type *)((long)&uStack_18 + 2));
    if (lVar3 == 0x20) {
LAB_0019a936:
      p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<Pattern> ThreeColourTripletsRecognizer::recognize()
{
	for (auto it : front_tile_count_of_triplets_or_quads)
	{
		if (it == 3)
		{
			return { Pattern::ThreeColourTriplets };
		}
	}

	return {};
}